

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Option * __thiscall CLI::Option::type_name(Option *this,string *typeval)

{
  string local_50 [32];
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_30;
  
  ::std::__cxx11::string::string(local_50,(string *)typeval);
  ::std::function<std::__cxx11::string()>::
  function<CLI::Option::type_name(std::__cxx11::string)::_lambda()_1_,void>
            ((function<std::__cxx11::string()> *)&local_30,(anon_class_32_1_50816887 *)local_50);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::operator=(&this->type_name_,&local_30);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  ::std::__cxx11::string::~string(local_50);
  return this;
}

Assistant:

Option *type_name(std::string typeval) {
        type_name_fn([typeval]() { return typeval; });
        return this;
    }